

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall
amrex::MLEBTensorOp::setBulkViscosity
          (MLEBTensorOp *this,int amrlev,Array<const_MultiFab_*,_3> *kappa)

{
  undefined8 in_RDX;
  int in_ESI;
  MultiFab *in_RDI;
  MultiFab *unaff_retaddr;
  int idim;
  size_type in_stack_ffffffffffffffc8;
  array<amrex::MultiFab,_3UL> *in_stack_ffffffffffffffd0;
  int local_1c;
  int in_stack_fffffffffffffff0;
  MultiFab *src;
  
  src = in_RDI;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 =
         (array<amrex::MultiFab,_3UL> *)
         std::array<amrex::MultiFab,_3UL>::operator[]
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    MultiFab::Copy(unaff_retaddr,src,in_ESI,in_stack_fffffffffffffff0,(int)((ulong)in_RDX >> 0x20),
                   (int)in_RDX);
  }
  *(undefined1 *)
   ((long)&in_RDI[2].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.m_ba_id.data + 5) =
       1;
  return;
}

Assistant:

void
MLEBTensorOp::setBulkViscosity (int amrlev, const Array<MultiFab const*,AMREX_SPACEDIM>& kappa)
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        MultiFab::Copy(m_kappa[amrlev][0][idim], *kappa[idim], 0, 0, 1, 0);
    }
    m_has_kappa = true;
}